

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    uchar *in,size_t insize,LodePNGColorType colortype,uint bitdepth)

{
  uint uVar1;
  uint uVar2;
  uchar *__ptr;
  uint uVar3;
  uint uVar4;
  uchar *local_260;
  LodePNGState local_258;
  
  local_260 = (uchar *)0x0;
  uVar3 = lodepng_decode_memory(&local_260,w,h,in,insize,colortype,bitdepth);
  __ptr = local_260;
  if (uVar3 == 0 && local_260 != (uchar *)0x0) {
    local_258.decoder.color_convert = 1;
    local_258.decoder.read_text_chunks = 1;
    local_258.decoder.remember_unknown_chunks = 0;
    local_258.decoder.max_text_size = 0x1000000;
    local_258.decoder.max_icc_size = 0x1000000;
    local_258.decoder.zlibsettings.ignore_adler32 = 0;
    local_258.decoder.zlibsettings.ignore_nlen = 0;
    local_258.decoder.zlibsettings.max_output_size = 0;
    local_258.decoder.zlibsettings.custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
    local_258.decoder.zlibsettings.custom_inflate =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
    local_258.decoder.zlibsettings.custom_context = (void *)0x0;
    local_258.decoder.ignore_crc = 0;
    local_258.decoder.ignore_critical = 0;
    local_258.decoder.ignore_end = 0;
    local_258.encoder.zlibsettings.btype = 2;
    local_258.encoder.zlibsettings.use_lz77 = 1;
    local_258.encoder.zlibsettings.windowsize = 0x800;
    local_258.encoder.zlibsettings.minmatch = 3;
    local_258.encoder.zlibsettings.nicematch = 0x80;
    local_258.encoder.zlibsettings.lazymatching = 1;
    local_258.encoder.zlibsettings.custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_258.encoder.zlibsettings.custom_deflate =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_258.encoder.zlibsettings.custom_context = (void *)0x0;
    local_258.encoder.filter_strategy = LFS_MINSUM;
    local_258.encoder.auto_convert = 1;
    local_258.encoder.filter_palette_zero = 1;
    local_258.encoder.predefined_filters = (uchar *)0x0;
    local_258.encoder.force_palette = 0;
    local_258.encoder.add_id = 0;
    local_258.encoder.text_compression = 1;
    local_258.info_raw.key_defined = 0;
    local_258.info_raw.key_r = 0;
    local_258.info_raw.key_g = 0;
    local_258.info_raw.key_b = 0;
    local_258.info_raw.palette = (uchar *)0x0;
    local_258.info_raw.palettesize = 0;
    local_258.info_png.color.key_defined = 0;
    local_258.info_png.color.key_r = 0;
    local_258.info_png.color.key_g = 0;
    local_258.info_png.color.key_b = 0;
    local_258.info_png.color.colortype = LCT_RGBA;
    local_258.info_png.color.bitdepth = 8;
    local_258.info_png.color.palette = (uchar *)0x0;
    local_258.info_png.color.palettesize = 0;
    local_258.info_png.interlace_method = 0;
    local_258.info_png.compression_method = 0;
    local_258.info_png.filter_method = 0;
    local_258.info_png.phys_defined = 0;
    local_258.info_png.gama_defined = 0;
    local_258.info_png.chrm_defined = 0;
    local_258.info_png.srgb_defined = 0;
    local_258.info_png.iccp_defined = 0;
    local_258.info_png.time_defined = 0;
    local_258.info_png.itext_transkeys = (char **)0x0;
    local_258.info_png.itext_strings = (char **)0x0;
    local_258.info_png.itext_keys = (char **)0x0;
    local_258.info_png.itext_langtags = (char **)0x0;
    local_258.info_png.text_strings = (char **)0x0;
    local_258.info_png.itext_num = 0;
    local_258.info_png.text_num = 0;
    local_258.info_png.text_keys = (char **)0x0;
    local_258.info_png.background_defined = 0;
    local_258.info_png.background_r = 0;
    local_258.info_png.background_g = 0;
    local_258.info_png.background_b = 0;
    local_258.info_png.iccp_name = (char *)0x0;
    local_258.info_png.iccp_profile = (uchar *)0x0;
    local_258.info_png.unknown_chunks_size[2]._4_4_ = 0;
    local_258.info_png.unknown_chunks_size._4_8_ = 0;
    local_258.info_png.unknown_chunks_size._12_8_ = 0;
    local_258.info_png.unknown_chunks_data._12_8_ = 0;
    local_258.info_png._300_8_ = 0;
    local_258.info_png._276_8_ = 0;
    local_258.info_png.unknown_chunks_data._4_8_ = 0;
    local_258.info_png.sbit_defined = 0;
    local_258.info_png.sbit_r = 0;
    local_258.info_png.sbit_g = 0;
    local_258.info_png.sbit_b = 0;
    local_258.error = 1;
    local_258.info_raw.bitdepth = bitdepth;
    uVar1 = *w;
    uVar2 = *h;
    local_258.info_raw.colortype = colortype;
    uVar4 = getNumColorChannels(colortype);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,__ptr,
               __ptr + ((ulong)((uint)((ulong)uVar2 * (ulong)uVar1) & 7) * (ulong)(uVar4 * bitdepth)
                        + 7 >> 3) + ((ulong)uVar2 * (ulong)uVar1 >> 3) * (ulong)(uVar4 * bitdepth));
    lodepng_state_cleanup(&local_258);
  }
  free(__ptr);
  return uVar3;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const unsigned char* in,
                size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer = 0;
  unsigned error = lodepng_decode_memory(&buffer, &w, &h, in, insize, colortype, bitdepth);
  if(buffer && !error) {
    State state;
    state.info_raw.colortype = colortype;
    state.info_raw.bitdepth = bitdepth;
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), buffer, &buffer[buffersize]);
  }
  lodepng_free(buffer);
  return error;
}